

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void rnn_parsefile(rnndb *db,char *file_orig)

{
  long lVar1;
  rnndb *db_00;
  int iVar2;
  char *__dest;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  FILE *__stream;
  char **__ptr;
  int iVar6;
  xmlNode *node;
  rnnbitset ***ppprVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long *plVar12;
  
  __dest = (char *)malloc(0x200);
  pcVar3 = getenv("RNN_PATH");
  pcVar8 = "./rnndb:../rnndb";
  if (pcVar3 != (char *)0x0) {
    pcVar8 = pcVar3;
  }
  while( true ) {
    pcVar3 = strchr(pcVar8,0x3a);
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen(pcVar8);
      pcVar3 = pcVar8 + sVar4;
    }
    lVar5 = (long)pcVar3 - (long)pcVar8;
    if (0x1fe < lVar5) {
      lVar5 = 0x1ff;
    }
    iVar2 = (int)lVar5;
    strncpy(__dest,pcVar8,(long)iVar2);
    snprintf(__dest + iVar2,(ulong)(0x1ff - iVar2),"/%s",file_orig);
    __stream = fopen(__dest,"r");
    if (__stream != (FILE *)0x0) break;
    pcVar8 = pcVar3 + (*pcVar3 == ':');
    if (pcVar3[*pcVar3 == ':'] == '\0') {
      strncpy(__dest,file_orig,0x1ff);
      __dest[0x1ff] = '\0';
LAB_0016e0f9:
      uVar11 = db->filesnum;
      uVar9 = 0;
      uVar10 = 0;
      if (0 < (int)uVar11) {
        uVar10 = (ulong)uVar11;
      }
      while (uVar10 != uVar9) {
        iVar2 = strcmp(db->files[uVar9],__dest);
        uVar9 = uVar9 + 1;
        if (iVar2 == 0) {
          return;
        }
      }
      iVar2 = db->filesmax;
      __ptr = db->files;
      if (iVar2 <= (int)uVar11) {
        iVar6 = 0x10;
        if (iVar2 != 0) {
          iVar6 = iVar2 * 2;
        }
        db->filesmax = iVar6;
        __ptr = (char **)realloc(__ptr,(long)iVar6 << 3);
        db->files = __ptr;
        uVar11 = db->filesnum;
      }
      db->filesnum = uVar11 + 1;
      __ptr[(int)uVar11] = __dest;
      lVar5 = xmlParseFile(__dest);
      if (lVar5 == 0) {
        fprintf(_stderr,"%s: couldn\'t open database file. Please set the env var RNN_PATH.\n",
                __dest);
        db->estatus = 1;
        return;
      }
      plVar12 = (long *)(lVar5 + 0x18);
      while (lVar1 = *plVar12, lVar1 != 0) {
        if (*(int *)(lVar1 + 8) == 1) {
          pcVar8 = *(char **)(lVar1 + 0x10);
          iVar2 = strcmp(pcVar8,"database");
          if (iVar2 == 0) {
            ppprVar7 = (rnnbitset ***)(lVar1 + 0x18);
            while (db_00 = (rnndb *)*ppprVar7, db_00 != (rnndb *)0x0) {
              if (((*(int *)&(db_00->copyright).license == 1) &&
                  (pcVar8 = __dest, iVar2 = trytop(db,__dest,(xmlNode *)db_00), iVar2 == 0)) &&
                 (iVar2 = trydoc(db_00,pcVar8,node), iVar2 == 0)) {
                fprintf(_stderr,"%s:%d: wrong tag in database: <%s>\n",__dest,
                        (ulong)*(ushort *)&db_00->files,(db_00->copyright).authors);
                db->estatus = 1;
              }
              ppprVar7 = &db_00->bitsets;
            }
          }
          else {
            fprintf(_stderr,"%s:%d: wrong top-level tag <%s>\n",__dest,
                    (ulong)*(ushort *)(lVar1 + 0x70),pcVar8);
            db->estatus = 1;
          }
        }
        plVar12 = (long *)(lVar1 + 0x30);
      }
      xmlFreeDoc(lVar5);
      return;
    }
  }
  fclose(__stream);
  goto LAB_0016e0f9;
}

Assistant:

void rnn_parsefile (struct rnndb *db, char *file_orig) {
	int i;
	char *file = (char *) malloc(512);

	resolve_using_path(file_orig, file, 512);

	for (i = 0; i < db->filesnum; i++)
		if (!strcmp(db->files[i], file))
			return;
		
	ADDARRAY(db->files, file);
	xmlDocPtr doc = xmlParseFile(file);
	if (!doc) {
		fprintf (stderr, "%s: couldn't open database file. Please set the env var RNN_PATH.\n", file);
		db->estatus = 1;
		return;
	}
	xmlNode *root = doc->children;
	while (root) {
		if (root->type != XML_ELEMENT_NODE) {
		} else if (strcmp(root->name, "database")) {
			fprintf (stderr, "%s:%d: wrong top-level tag <%s>\n", file, root->line, root->name);
			db->estatus = 1;
		} else {
			xmlNode *chain = root->children;
			while (chain) {
				if (chain->type != XML_ELEMENT_NODE) {
				} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
					fprintf (stderr, "%s:%d: wrong tag in database: <%s>\n", file, chain->line, chain->name);
					db->estatus = 1;
				}
				chain = chain->next;
			}
		}
		root = root->next;
	}
	xmlFreeDoc(doc);
}